

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zeFenceQueryStatus(ze_fence_handle_t hFence)

{
  ze_pfnFenceQueryStatus_t pfnQueryStatus;
  dditable_t *dditable;
  ze_result_t result;
  ze_fence_handle_t hFence_local;
  
  if (*(code **)(*(long *)(hFence + 8) + 0x448) == (code *)0x0) {
    hFence_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hFence_local._4_4_ = (**(code **)(*(long *)(hFence + 8) + 0x448))(*(undefined8 *)hFence);
  }
  return hFence_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFenceQueryStatus(
        ze_fence_handle_t hFence                        ///< [in] handle of the fence
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_fence_object_t*>( hFence )->dditable;
        auto pfnQueryStatus = dditable->ze.Fence.pfnQueryStatus;
        if( nullptr == pfnQueryStatus )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hFence = reinterpret_cast<ze_fence_object_t*>( hFence )->handle;

        // forward to device-driver
        result = pfnQueryStatus( hFence );

        return result;
    }